

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
::Grow(HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
       *this)

{
  bool bVar1;
  size_t sVar2;
  reference pvVar3;
  size_t sVar4;
  ulong uVar5;
  ulong index;
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_RDI;
  size_t offset;
  int nProbes;
  size_t baseOffset;
  size_t i;
  size_t newCapacity;
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  newTable;
  size_t currentCapacity;
  pair<pbrt::Light,_unsigned_long> *in_stack_ffffffffffffff48;
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff60;
  int local_80;
  polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>
  *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffffa0;
  ulong local_58;
  unsigned_long local_40 [2];
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  local_30;
  size_t local_10;
  
  local_10 = capacity((HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
                       *)0x902661);
  local_40[1] = 0x40;
  local_40[0] = local_10 << 1;
  std::max<unsigned_long>(local_40 + 1,local_40);
  pstd::
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  ::get_allocator(in_RDI);
  pstd::
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  ::vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  sVar2 = pstd::
          vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
          ::size(&local_30);
  for (local_58 = 0; local_58 < local_10; local_58 = local_58 + 1) {
    pvVar3 = pstd::
             vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
             ::operator[](in_RDI,local_58);
    bVar1 = pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>::has_value(pvVar3);
    if (bVar1) {
      pstd::
      vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
      ::operator[](in_RDI,local_58);
      in_stack_ffffffffffffff60 =
           (vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
            *)pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>::operator->
                        ((optional<std::pair<pbrt::Light,_unsigned_long>_> *)0x90272a);
      Light::Light((Light *)in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->first);
      sVar4 = std::hash<pbrt::Light>::operator()
                        ((hash<pbrt::Light> *)in_stack_ffffffffffffff60,
                         (Light *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      uVar5 = sVar4 & sVar2 - 1;
      local_80 = 0;
      while( true ) {
        index = uVar5 + (long)(local_80 / 2) + (ulong)((uint)(local_80 * local_80) >> 1) & sVar2 - 1
        ;
        pvVar3 = pstd::
                 vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
                 ::operator[](&local_30,index);
        in_stack_ffffffffffffff5f = pstd::optional::operator_cast_to_bool((optional *)pvVar3);
        if (!(bool)in_stack_ffffffffffffff5f) break;
        local_80 = local_80 + 1;
      }
      pstd::
      vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
      ::operator[](in_RDI,local_58);
      in_stack_ffffffffffffff50 =
           (vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
            *)pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>::operator*
                        ((optional<std::pair<pbrt::Light,_unsigned_long>_> *)0x9027dd);
      pstd::
      vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
      ::operator[](&local_30,index);
      pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>::operator=
                ((optional<std::pair<pbrt::Light,_unsigned_long>_> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
    }
  }
  pstd::
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  ::operator=(in_RDI,in_stack_ffffffffffffff60);
  pstd::
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  ::~vector(in_stack_ffffffffffffff50);
  return;
}

Assistant:

void Grow() {
        size_t currentCapacity = capacity();
        pstd::vector<TableEntry> newTable(std::max<size_t>(64, 2 * currentCapacity),
                                          table.get_allocator());
        size_t newCapacity = newTable.size();
        for (size_t i = 0; i < currentCapacity; ++i) {
            // Insert _table[i]_ into _newTable_ if it is set
            if (!table[i].has_value())
                continue;
            size_t baseOffset = Hash()(table[i]->first) & (newCapacity - 1);
            for (int nProbes = 0;; ++nProbes) {
                size_t offset = (baseOffset + nProbes / 2 + nProbes * nProbes / 2) &
                                (newCapacity - 1);
                if (!newTable[offset]) {
                    newTable[offset] = std::move(*table[i]);
                    break;
                }
            }
        }
        table = std::move(newTable);
    }